

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void av1_pick_uniform_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bs,int64_t ref_best_rd)

{
  int iVar1;
  int n4;
  int32_t iVar2;
  int iVar3;
  AV1_COMP *cpi_00;
  RD_STATS *rd_stats_00;
  BLOCK_SIZE in_CL;
  RD_STATS *in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t in_R8;
  BLOCK_SIZE unaff_retaddr;
  int64_t in_stack_00000008;
  int64_t dist;
  MB_RD_INFO *mb_rd_info;
  AV1_COMP *in_stack_00000020;
  int match_index;
  int within_border;
  int num_blks;
  MB_RD_RECORD *mb_rd_record;
  uint32_t hash;
  int mi_col;
  int mi_row;
  int is_inter;
  TxfmSearchParams *tx_params;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  BLOCK_SIZE in_stack_00000847;
  int64_t in_stack_00000848;
  RD_STATS *in_stack_00000850;
  MACROBLOCK *in_stack_00000858;
  AV1_COMP *in_stack_00000860;
  int in_stack_0000105c;
  int64_t *in_stack_00001060;
  BLOCK_SIZE in_stack_0000106f;
  MACROBLOCK *in_stack_00001070;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool bVar4;
  undefined7 in_stack_ffffffffffffff88;
  BLOCK_SIZE in_stack_ffffffffffffff8f;
  MACROBLOCK *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  MACROBLOCK *x_00;
  uint32_t hash_00;
  int n4_00;
  int iVar5;
  MACROBLOCK *x_01;
  
  cpi_00 = (AV1_COMP *)(in_RSI + 0x1a0);
  x_01 = (MACROBLOCK *)**(long **)(in_RSI + 0x2058);
  rd_stats_00 = (RD_STATS *)(in_RSI + 0x24dcc);
  iVar1 = is_inter_block((MB_MODE_INFO *)
                         CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  iVar5 = *(int *)&cpi_00->ppi;
  n4_00 = *(int *)((long)&cpi_00->ppi + 4);
  av1_init_rd_stats(in_RDX);
  hash_00 = 0;
  x_00 = (MACROBLOCK *)0x0;
  n4 = bsize_to_num_blk(in_CL);
  if ((iVar1 != 0) && (*(int *)(in_RDI + 0x60c28) != 0)) {
    bVar4 = false;
    if ((*(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xe9] <= iVar5) &&
       ((bVar4 = false,
        (int)(iVar5 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [in_CL]) <
        *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xe9] + 2) &&
        (bVar4 = false,
        *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xe9] + 4) <= n4_00)))) {
      bVar4 = (int)(n4_00 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [in_CL]) <
              *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant_shift[0xe9] + 6);
    }
    in_stack_ffffffffffffffa0 = (uint)bVar4;
    if (in_stack_ffffffffffffffa0 != 0) {
      hash_00 = get_block_residue_hash(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
      x_00 = *(MACROBLOCK **)(in_RSI + 0x25610);
      iVar2 = find_mb_rd_info((MB_RD_RECORD *)x_00,in_R8,hash_00);
      if (iVar2 != -1) {
        fetch_mb_rd_info(n4,(MB_RD_INFO *)CONCAT44(iVar2,in_stack_ffffffffffffff98),
                         (RD_STATS *)((MB_RD_INFO *)x_00->plane + iVar2),
                         (MACROBLOCK *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
                        );
        return;
      }
      in_stack_ffffffffffffff9c = 0xffffffff;
    }
  }
  if ((((*(int *)&rd_stats_00->skip_txfm == 0) || (iVar1 == 0)) ||
      (*(int *)((cpi_00->enc_quant_dequant_params).quants.y_zbin[0x9b] +
               (ulong)((byte)*(undefined2 *)((long)&x_01->plane[1].coeff + 7) & 7) * 2 + 2) != 0))
     || (iVar3 = predict_skip_txfm(in_stack_00001070,in_stack_0000106f,in_stack_00001060,
                                   in_stack_0000105c), iVar3 == 0)) {
    if (*(int *)((cpi_00->enc_quant_dequant_params).quants.y_zbin[0x9b] +
                (ulong)((byte)*(undefined2 *)((long)&x_01->plane[1].coeff + 7) & 7) * 2 + 2) == 0) {
      if ((char)rd_stats_00->sse == '\x02') {
        choose_largest_tx_size
                  (in_stack_00000020,(MACROBLOCK *)mb_rd_info,
                   (RD_STATS *)CONCAT17(dist._7_1_,(undefined7)dist),in_stack_00000008,unaff_retaddr
                  );
      }
      else {
        choose_tx_size_type_from_rd
                  (in_stack_00000860,in_stack_00000858,in_stack_00000850,in_stack_00000848,
                   in_stack_00000847);
      }
    }
    else {
      choose_smallest_tx_size
                (cpi_00,x_01,rd_stats_00,CONCAT44(iVar1,iVar5),(BLOCK_SIZE)((uint)n4_00 >> 0x18));
    }
    if (x_00 != (MACROBLOCK *)0x0) {
      save_mb_rd_info(n4_00,hash_00,x_00,(RD_STATS *)CONCAT44(n4,in_stack_ffffffffffffffa0),
                      (MB_RD_RECORD *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
      ;
    }
  }
  else {
    set_skip_txfm((MACROBLOCK *)in_stack_00000020,(RD_STATS *)mb_rd_info,dist._7_1_,
                  in_stack_00000008);
    if (x_00 != (MACROBLOCK *)0x0) {
      save_mb_rd_info(n4_00,hash_00,x_00,(RD_STATS *)CONCAT44(n4,in_stack_ffffffffffffffa0),
                      (MB_RD_RECORD *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
      ;
    }
  }
  return;
}

Assistant:

void av1_pick_uniform_tx_size_type_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                                       RD_STATS *rd_stats, BLOCK_SIZE bs,
                                       int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *tx_params = &x->txfm_search_params;
  assert(bs == mbmi->bsize);
  const int is_inter = is_inter_block(mbmi);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_init_rd_stats(rd_stats);

  // Hashing based speed feature for inter blocks. If the hash of the residue
  // block is found in the table, use previously saved search results and
  // terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int num_blks = bsize_to_num_blk(bs);
  if (is_inter && cpi->sf.rd_sf.use_mb_rd_hash) {
    const int within_border =
        mi_row >= xd->tile.mi_row_start &&
        (mi_row + mi_size_high[bs] < xd->tile.mi_row_end) &&
        mi_col >= xd->tile.mi_col_start &&
        (mi_col + mi_size_wide[bs] < xd->tile.mi_col_end);
    if (within_border) {
      hash = get_block_residue_hash(x, bs);
      mb_rd_record = x->txfm_search_info.mb_rd_record;
      const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
      if (match_index != -1) {
        MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
        fetch_mb_rd_info(num_blks, mb_rd_info, rd_stats, x);
        return;
      }
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (tx_params->skip_txfm_level && is_inter &&
      !xd->lossless[mbmi->segment_id] &&
      predict_skip_txfm(x, bs, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    // Populate rdstats as per skip decision
    set_skip_txfm(x, rd_stats, bs, dist);
    // Save the RD search results into mb_rd_record.
    if (mb_rd_record) {
      save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
    }
    return;
  }

  if (xd->lossless[mbmi->segment_id]) {
    // Lossless mode can only pick the smallest (4x4) transform size.
    choose_smallest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else if (tx_params->tx_size_search_method == USE_LARGESTALL) {
    choose_largest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else {
    choose_tx_size_type_from_rd(cpi, x, rd_stats, ref_best_rd, bs);
  }

  // Save the RD search results into mb_rd_record for possible reuse in future.
  if (mb_rd_record) {
    save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
  }
}